

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_setupresult(ASMState *as,IRIns *ir,CCallInfo *ci)

{
  byte bVar1;
  byte bVar2;
  MCode MVar3;
  uint uVar4;
  MCode *pMVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  MCode *pMVar9;
  Reg RVar10;
  int iVar11;
  uint dst;
  uint uVar13;
  long lVar12;
  IRIns *ir_00;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  RegSet drop;
  
  if (*(char *)((long)ir + 0xd) == '\x10') {
    bVar14 = (*(byte *)((long)ir + 0xc) & 0x1f) != 0;
  }
  else {
    bVar14 = false;
  }
  bVar2 = (ir->field_1).r & 0x1f;
  uVar13 = 0xffff0fc7;
  if (-1 < (char)(ir->field_1).r) {
    uVar13 = -2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2;
  }
  drop = uVar13 & (uint)((*(byte *)((long)&ci->flags + 1) & 4) >> 2) * 0x10000 - 0xf039;
  if ((bVar14) && (-1 < *(char *)((long)ir + 0xe))) {
    drop = drop & ~(1 << ((int)*(char *)((long)ir + 0xe) & 0x1fU));
  }
  ra_evictset(as,drop);
  bVar2 = (ir->field_1).r;
  uVar13 = (uint)bVar2;
  if (((char)bVar2 < '\0') && ((ir->field_1).s == '\0')) {
    return;
  }
  bVar6 = (ir->field_1).t.irt & 0x1f;
  uVar8 = (uint)bVar2;
  if ((byte)(bVar6 - 0xd) < 2) {
    if ((ci->flags & 0x200) != 0) {
      bVar6 = (ir->field_1).s;
      if (-1 < (char)bVar2) {
        iVar11 = 1 << (bVar2 & 0x1f);
        uVar15._0_4_ = as->freeset;
        uVar15._4_4_ = as->modset;
        uVar15 = CONCAT44(iVar11,iVar11) | uVar15;
        as->freeset = (int)uVar15;
        as->modset = (int)(uVar15 >> 0x20);
        pMVar5 = as->mcp;
        pMVar5[-1] = bVar2 * '\b' | 0xc0;
        pMVar5[-5] = 'f';
        pMVar5[-4] = 'f';
        pMVar5[-3] = '\x0f';
        pMVar5[-2] = 'n';
        pMVar5[-4] = bVar2 >> 1 & 4 | 0x48;
        as->mcp = pMVar5 + -5;
      }
      if (bVar6 == 0) {
        return;
      }
      pMVar5 = as->mcp;
      if (bVar6 < 0x20) {
        pMVar5[-1] = (MCode)((uint)bVar6 << 2);
        MVar3 = 'D';
        lVar12 = -1;
      }
      else {
        *(uint *)(pMVar5 + -4) = (uint)bVar6 << 2;
        MVar3 = 0x84;
        lVar12 = -4;
      }
      pMVar9 = pMVar5 + lVar12 + -4;
      pMVar5[lVar12 + -1] = '$';
      pMVar5[lVar12 + -2] = MVar3;
      pMVar9[0] = 'H';
      pMVar9[1] = 0x89;
      as->mcp = pMVar9;
      return;
    }
    RVar10 = 0x10;
LAB_001438a6:
    ra_destreg(as,ir,RVar10);
    return;
  }
  if (!bVar14) {
    RVar10 = 0;
    goto LAB_001438a6;
  }
  bVar1 = *(byte *)((long)ir + 0xe);
  dst = (uint)bVar1;
  uVar4 = as->freeset;
  if ((bVar1 != 0 && bVar2 != 0) && (uVar4 & 1) == 0) {
    ra_restore(as,(uint)(ushort)as->cost[0]);
    uVar4 = as->freeset;
  }
  if ((bVar2 != 2 && (uVar4 & 4) == 0) && bVar1 != 2) {
    ra_restore(as,(uint)(ushort)as->cost[2]);
  }
  ir_00 = (IRIns *)((ulong)(~(uint)(0x302fec8L >> bVar6) & 8) + (long)ir);
  if ((char)bVar2 < '\0') {
    if ((char)bVar1 < '\0') goto LAB_001439bb;
    iVar11 = 1 << (bVar1 & 0x1f);
    uVar16._0_4_ = as->freeset;
    uVar16._4_4_ = as->modset;
    uVar16 = CONCAT44(iVar11,iVar11) | uVar16;
    as->freeset = (int)uVar16;
    as->modset = (int)(uVar16 >> 0x20);
    uVar13 = 0;
LAB_001438ec:
    if (dst != 2) {
      if (bVar1 == 0) {
        uVar8._0_2_ = *(IROpT *)((long)ir_00 + 4);
        uVar8._2_2_ = *(IRRef1 *)((long)ir_00 + 6);
        uVar8 = -(uint)((0x605fd9U >> (uVar8 & 0x1f) & 1) != 0) & 0x80200;
        pMVar5 = as->mcp;
        pMVar5[-2] = 0x8b;
        pMVar5[-1] = 0xc2;
        if ((short)uVar8 == 0) {
          pMVar5 = pMVar5 + -2;
        }
        else {
          pMVar5[-3] = (byte)(uVar8 >> 0x10) | 0x40;
          pMVar5 = pMVar5 + -3;
        }
        as->mcp = pMVar5;
      }
      else {
        emit_movrr(as,ir_00,dst,2);
      }
    }
LAB_001439a6:
    dst = uVar13;
    if (uVar13 == 0) goto LAB_001439bb;
LAB_001439b4:
    RVar10 = 0;
  }
  else {
    uVar7 = as->freeset | 1 << (uVar8 & 0x1f);
    as->freeset = uVar7;
    uVar4 = as->modset | 1 << (uVar8 & 0x1f);
    as->modset = uVar4;
    if ((char)bVar1 < '\0') {
      if (uVar8 != 2) goto LAB_001439a6;
      dst = 2;
      goto LAB_001439b4;
    }
    as->freeset = uVar7 | 1 << (bVar1 & 0x1f);
    as->modset = uVar4 | 1 << (bVar1 & 0x1f);
    uVar13 = (uint)bVar2;
    if (uVar8 != 2) goto LAB_001438ec;
    if (bVar1 == 0) {
      pMVar5 = as->mcp;
      as->mcp = pMVar5 + -1;
      pMVar5[-1] = 0x92;
      goto LAB_001439bb;
    }
    emit_movrr(as,ir_00,2,0);
    if (dst == 2) goto LAB_001439bb;
    RVar10 = 2;
  }
  emit_movrr(as,ir_00,dst,RVar10);
LAB_001439bb:
  if (*(byte *)((long)ir + 0xf) != 0) {
    RVar10 = 0x80202;
    if ((0x605fd9U >> (*(uint *)((long)ir + 0xc) & 0x1f) & 1) == 0) {
      RVar10 = 2;
    }
    emit_rmro(as,XO_MOVto,RVar10,4,(uint)*(byte *)((long)ir + 0xf) << 2);
  }
  if ((ir->field_1).s == 0) {
    return;
  }
  uVar13._0_2_ = *(IROpT *)((long)ir + 4);
  uVar13._2_2_ = *(IRRef1 *)((long)ir + 6);
  emit_rmro(as,XO_MOVto,-(uint)((0x605fd9U >> (uVar13 & 0x1f) & 1) != 0) & 0x80200,4,
            (uint)(ir->field_1).s << 2);
  return;
}

Assistant:

static void asm_setupresult(ASMState *as, IRIns *ir, const CCallInfo *ci)
{
  RegSet drop = RSET_SCRATCH;
  int hiop = ((ir+1)->o == IR_HIOP && !irt_isnil((ir+1)->t));
  if ((ci->flags & CCI_NOFPRCLOBBER))
    drop &= ~RSET_FPR;
  if (ra_hasreg(ir->r))
    rset_clear(drop, ir->r);  /* Dest reg handled below. */
  if (hiop && ra_hasreg((ir+1)->r))
    rset_clear(drop, (ir+1)->r);  /* Dest reg handled below. */
  ra_evictset(as, drop);  /* Evictions must be performed first. */
  if (ra_used(ir)) {
    if (irt_isfp(ir->t)) {
      int32_t ofs = sps_scale(ir->s);  /* Use spill slot or temp slots. */
#if LJ_64
      if ((ci->flags & CCI_CASTU64)) {
	Reg dest = ir->r;
	if (ra_hasreg(dest)) {
	  ra_free(as, dest);
	  ra_modified(as, dest);
	  emit_rr(as, XO_MOVD, dest|REX_64, RID_RET);  /* Really MOVQ. */
	}
	if (ofs) emit_movtomro(as, RID_RET|REX_64, RID_ESP, ofs);
      } else {
	ra_destreg(as, ir, RID_FPRET);
      }
#else
      /* Number result is in x87 st0 for x86 calling convention. */
      Reg dest = ir->r;
      if (ra_hasreg(dest)) {
	ra_free(as, dest);
	ra_modified(as, dest);
	emit_rmro(as, irt_isnum(ir->t) ? XO_MOVSD : XO_MOVSS,
		  dest, RID_ESP, ofs);
      }
      if ((ci->flags & CCI_CASTU64)) {
	emit_movtomro(as, RID_RETLO, RID_ESP, ofs);
	emit_movtomro(as, RID_RETHI, RID_ESP, ofs+4);
      } else {
	emit_rmro(as, irt_isnum(ir->t) ? XO_FSTPq : XO_FSTPd,
		  irt_isnum(ir->t) ? XOg_FSTPq : XOg_FSTPd, RID_ESP, ofs);
      }
#endif
    } else if (hiop) {
      ra_destpair(as, ir);
    } else {
      lj_assertA(!irt_ispri(ir->t), "PRI dest");
      ra_destreg(as, ir, RID_RET);
    }
  } else if (LJ_32 && irt_isfp(ir->t) && !(ci->flags & CCI_CASTU64)) {
    emit_x87op(as, XI_FPOP);  /* Pop unused result from x87 st0. */
  }
}